

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall slang::ast::Scope::handleNameConflict(Scope *this,Symbol *member)

{
  char *pcVar1;
  size_t *psVar2;
  undefined4 uVar3;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  long lVar4;
  size_t __n;
  char *__s1;
  uint uVar5;
  int iVar6;
  uint64_t uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
  uVar7 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    (this_00,&member->name);
  uVar10 = uVar7 >> ((byte)*this_00 & 0x3f);
  lVar4 = *(long *)(this_00 + 0x10);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar7 & 0xff];
  __n = (member->name)._M_len;
  __s1 = (member->name)._M_str;
  lVar11 = 0;
  do {
    pcVar1 = (char *)(lVar4 + uVar10 * 0x10);
    local_48 = (char)uVar3;
    cStack_47 = (char)((uint)uVar3 >> 8);
    cStack_46 = (char)((uint)uVar3 >> 0x10);
    cStack_45 = (char)((uint)uVar3 >> 0x18);
    auVar13[0] = -(*pcVar1 == local_48);
    auVar13[1] = -(pcVar1[1] == cStack_47);
    auVar13[2] = -(pcVar1[2] == cStack_46);
    auVar13[3] = -(pcVar1[3] == cStack_45);
    auVar13[4] = -(pcVar1[4] == local_48);
    auVar13[5] = -(pcVar1[5] == cStack_47);
    auVar13[6] = -(pcVar1[6] == cStack_46);
    auVar13[7] = -(pcVar1[7] == cStack_45);
    auVar13[8] = -(pcVar1[8] == local_48);
    auVar13[9] = -(pcVar1[9] == cStack_47);
    auVar13[10] = -(pcVar1[10] == cStack_46);
    auVar13[0xb] = -(pcVar1[0xb] == cStack_45);
    auVar13[0xc] = -(pcVar1[0xc] == local_48);
    auVar13[0xd] = -(pcVar1[0xd] == cStack_47);
    auVar13[0xe] = -(pcVar1[0xe] == cStack_46);
    auVar13[0xf] = -(pcVar1[0xf] == cStack_45);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
    if (uVar8 != 0) {
      lVar9 = *(long *)(this_00 + 0x18);
      do {
        uVar5 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        psVar2 = (size_t *)(lVar9 + uVar10 * 0x168 + (ulong)uVar5 * 0x18);
        bVar12 = __n == *psVar2;
        if (bVar12 && __n != 0) {
          iVar6 = bcmp(__s1,(void *)psVar2[1],__n);
          bVar12 = iVar6 == 0;
        }
        if (bVar12) {
          if (member->kind != ExplicitImport) {
            reportNameConflict(this,member,(Symbol *)psVar2[2]);
            return;
          }
          checkImportConflict(this,member,(Symbol *)psVar2[2]);
          return;
        }
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
    }
    lVar9 = uVar10 + lVar11;
    lVar11 = lVar11 + 1;
    uVar10 = lVar9 + 1U & *(ulong *)(this_00 + 8);
  } while( true );
}

Assistant:

void Scope::handleNameConflict(const Symbol& member) const {
    auto existing = nameMap->find(member.name)->second;
    SLANG_ASSERT(existing);
    if (member.kind == SymbolKind::ExplicitImport)
        checkImportConflict(member, *existing);
    else
        reportNameConflict(member, *existing);
}